

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  stbi__zhuffman *z_00;
  uint uVar1;
  byte *pbVar2;
  stbi_uc *psVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  stbi_uc *psVar12;
  uint uVar13;
  stbi_uc sVar14;
  byte *pbVar15;
  byte *pbVar16;
  char *pcVar17;
  ulong uVar18;
  stbi__uint32 sVar19;
  stbi__uint32 sVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  long in_FS_OFFSET;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  undefined8 local_a08;
  undefined7 uStack_a00;
  undefined4 uStack_9f9;
  byte bStack_9e9;
  stbi_uc local_9e8 [468];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_00103608:
    a->num_bits = 0;
    a->code_buffer = 0;
    z = &a->z_length;
    z_00 = &a->z_distance;
    iVar11 = 0;
    do {
      if (iVar11 < 1) {
        stbi__fill_bits(a);
        iVar11 = a->num_bits;
      }
      uVar1 = a->code_buffer;
      sVar19 = uVar1 >> 1;
      a->code_buffer = sVar19;
      iVar6 = iVar11 + -1;
      a->num_bits = iVar6;
      if (iVar11 < 3) {
        stbi__fill_bits(a);
        iVar6 = a->num_bits;
        sVar19 = a->code_buffer;
      }
      sVar20 = sVar19 >> 2;
      a->code_buffer = sVar20;
      uVar5 = iVar6 - 2;
      a->num_bits = uVar5;
      switch(sVar19 & 3) {
      case 0:
        if ((uVar5 & 7) != 0) {
          stbi__zreceive(a,uVar5 & 7);
          uVar5 = a->num_bits;
        }
        if (0 < (int)uVar5) {
          uVar13 = a->code_buffer;
          uVar21 = uVar5 - 1 >> 3;
          uVar23 = (ulong)(uVar21 + 1);
          uVar18 = 0xffffffffffffffff;
          do {
            *(char *)((long)local_814.fast + uVar18 + 1) = (char)uVar13;
            uVar13 = uVar13 >> 8;
            uVar18 = uVar18 + 1;
          } while (uVar21 != uVar18);
          iVar11 = uVar5 - (uVar5 - 1 & 0xfffffff8);
          a->code_buffer = uVar13;
          a->num_bits = iVar11 + -8;
          if (iVar11 == 8) {
            if (uVar18 < 3) goto LAB_00103ad7;
            goto LAB_00103b05;
          }
LAB_00103bc2:
          pcVar17 = "zlib corrupt";
LAB_00103bd9:
          *(char **)(in_FS_OFFSET + -0x20) = pcVar17;
          return 0;
        }
        if ((int)uVar5 < 0) goto LAB_00103bc2;
        uVar23 = 0;
LAB_00103ad7:
        psVar12 = a->zbuffer;
        psVar3 = a->zbuffer_end;
        do {
          if (psVar12 < psVar3) {
            a->zbuffer = psVar12 + 1;
            sVar14 = *psVar12;
            psVar12 = psVar12 + 1;
          }
          else {
            sVar14 = '\0';
          }
          *(stbi_uc *)((long)local_814.fast + uVar23) = sVar14;
          uVar23 = uVar23 + 1;
        } while (uVar23 != 4);
LAB_00103b05:
        if ((local_814.fast[1] ^ local_814.fast[0]) != 0xffff) goto LAB_00103bc2;
        psVar12 = a->zbuffer;
        uVar23 = (ulong)local_814.fast[0];
        if (a->zbuffer_end < psVar12 + uVar23) {
          pcVar17 = "read past buffer";
          goto LAB_00103bd9;
        }
        pcVar17 = a->zout;
        if (a->zout_end < pcVar17 + uVar23) {
          iVar11 = stbi__zexpand(a,pcVar17,(uint)local_814.fast[0]);
          if (iVar11 == 0) {
            return 0;
          }
          psVar12 = a->zbuffer;
          pcVar17 = a->zout;
        }
        memcpy(pcVar17,psVar12,uVar23);
        a->zbuffer = a->zbuffer + uVar23;
        a->zout = a->zout + uVar23;
        goto LAB_00103b70;
      case 1:
        iVar11 = stbi__zbuild_huffman
                           (z,
                            "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                            ,0x120);
        if (iVar11 == 0) {
          return 0;
        }
        iVar11 = stbi__zbuild_huffman
                           (z_00,
                            "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                            ,0x20);
        break;
      case 2:
        if (iVar6 < 7) {
          stbi__fill_bits(a);
          uVar5 = a->num_bits;
          sVar20 = a->code_buffer;
        }
        uVar13 = sVar20 >> 5;
        a->code_buffer = uVar13;
        iVar11 = uVar5 - 5;
        a->num_bits = iVar11;
        if ((int)uVar5 < 10) {
          stbi__fill_bits(a);
          iVar11 = a->num_bits;
          uVar13 = a->code_buffer;
        }
        uVar5 = uVar13 >> 5;
        a->code_buffer = uVar5;
        iVar6 = iVar11 + -5;
        a->num_bits = iVar6;
        if (iVar11 < 9) {
          stbi__fill_bits(a);
          iVar6 = a->num_bits;
          uVar5 = a->code_buffer;
        }
        uVar21 = (sVar20 & 0x1f) + 0x101;
        iVar11 = (uVar13 & 0x1f) + 1;
        uVar13 = uVar5 >> 4;
        a->code_buffer = uVar13;
        iVar6 = iVar6 + -4;
        a->num_bits = iVar6;
        local_a08 = 0;
        uStack_a00 = 0;
        uStack_9f9 = 0;
        uVar23 = 0;
        do {
          uVar9 = uVar13;
          if (iVar6 < 3) {
            stbi__fill_bits(a);
            iVar6 = a->num_bits;
            uVar9 = a->code_buffer;
          }
          uVar13 = uVar9 >> 3;
          a->code_buffer = uVar13;
          iVar6 = iVar6 + -3;
          a->num_bits = iVar6;
          *(byte *)((long)&local_a08 +
                   (ulong)(byte)(&stbi__compute_huffman_codes_length_dezigzag)[uVar23]) =
               (byte)uVar9 & 7;
          uVar23 = uVar23 + 1;
        } while ((uVar5 & 0xf) + 4 != uVar23);
        iVar6 = stbi__zbuild_huffman(&local_814,(stbi_uc *)&local_a08,0x13);
        if (iVar6 == 0) {
          return 0;
        }
        iVar22 = uVar21 + iVar11;
        iVar6 = 0;
        do {
          uVar5 = stbi__zhuffman_decode(a,&local_814);
          if (0x12 < uVar5) goto LAB_00103b95;
          if (uVar5 < 0x10) {
            local_9e8[iVar6] = (char)uVar5;
            iVar6 = iVar6 + 1;
          }
          else {
            iVar10 = a->num_bits;
            if (uVar5 == 0x11) {
              if (iVar10 < 3) {
                stbi__fill_bits(a);
                iVar10 = a->num_bits;
              }
              uVar5 = a->code_buffer;
              a->code_buffer = uVar5 >> 3;
              a->num_bits = iVar10 + -3;
              uVar5 = (uVar5 & 7) + 3;
LAB_001038f4:
              uVar13 = 0;
            }
            else {
              if (uVar5 != 0x10) {
                if (iVar10 < 7) {
                  stbi__fill_bits(a);
                  iVar10 = a->num_bits;
                }
                uVar5 = a->code_buffer;
                a->code_buffer = uVar5 >> 7;
                a->num_bits = iVar10 + -7;
                uVar5 = (uVar5 & 0x7f) + 0xb;
                goto LAB_001038f4;
              }
              if (iVar10 < 2) {
                stbi__fill_bits(a);
                iVar10 = a->num_bits;
              }
              uVar5 = a->code_buffer;
              a->code_buffer = uVar5 >> 2;
              a->num_bits = iVar10 + -2;
              if (iVar6 == 0) goto LAB_00103b95;
              uVar5 = (uVar5 & 3) + 3;
              uVar13 = (uint)(&bStack_9e9)[iVar6];
            }
            if (iVar22 - iVar6 < (int)uVar5) goto LAB_00103b95;
            memset(local_9e8 + iVar6,uVar13,(ulong)uVar5);
            iVar6 = iVar6 + uVar5;
          }
        } while (iVar6 < iVar22);
        if (iVar6 != iVar22) {
LAB_00103b95:
          pcVar17 = "bad codelengths";
          goto LAB_00103bd9;
        }
        iVar6 = stbi__zbuild_huffman(z,local_9e8,uVar21);
        if (iVar6 == 0) {
          return 0;
        }
        iVar11 = stbi__zbuild_huffman(z_00,local_9e8 + uVar21,iVar11);
        break;
      case 3:
        goto LAB_00103be4;
      }
      if (iVar11 == 0) {
        return 0;
      }
      pcVar17 = a->zout;
LAB_00103972:
      while (uVar5 = stbi__zhuffman_decode(a,z), (int)uVar5 < 0x100) {
        if ((int)uVar5 < 0) goto LAB_00103b8c;
        if (a->zout_end <= pcVar17) {
          iVar11 = stbi__zexpand(a,pcVar17,1);
          if (iVar11 == 0) {
            return 0;
          }
          pcVar17 = a->zout;
        }
        *pcVar17 = (char)uVar5;
        pcVar17 = pcVar17 + 1;
      }
      if (uVar5 != 0x100) {
        if (uVar5 < 0x11e) {
          uVar23 = (ulong)(uVar5 - 0x101);
          uVar5 = stbi__zlength_base[uVar23];
          if (0xffffffffffffffeb < uVar23 - 0x1c) {
            uVar13 = stbi__zreceive(a,stbi__zlength_extra[uVar23]);
            uVar5 = uVar5 + uVar13;
          }
          uVar13 = stbi__zhuffman_decode(a,z_00);
          if (uVar13 < 0x1e) {
            iVar11 = stbi__zdist_base[uVar13];
            if (3 < uVar13) {
              uVar13 = stbi__zreceive(a,stbi__zdist_extra[uVar13]);
              iVar11 = iVar11 + uVar13;
            }
            if ((long)pcVar17 - (long)a->zout_start < (long)iVar11) {
              pcVar17 = "bad dist";
              goto LAB_00103bd9;
            }
            if (a->zout_end < pcVar17 + (int)uVar5) {
              iVar6 = stbi__zexpand(a,pcVar17,uVar5);
              if (iVar6 == 0) {
                return 0;
              }
              pcVar17 = a->zout;
            }
            lVar7 = -(long)iVar11;
            if (iVar11 == 1) {
              if (uVar5 != 0) {
                memset(pcVar17,(uint)(byte)pcVar17[lVar7],(ulong)uVar5);
                pcVar17 = pcVar17 + (ulong)(uVar5 - 1) + 1;
              }
            }
            else {
              for (; uVar5 != 0; uVar5 = uVar5 - 1) {
                *pcVar17 = pcVar17[lVar7];
                pcVar17 = pcVar17 + 1;
              }
            }
            goto LAB_00103972;
          }
        }
LAB_00103b8c:
        pcVar17 = "bad huffman code";
        goto LAB_00103bd9;
      }
      a->zout = pcVar17;
LAB_00103b70:
      if ((uVar1 & 1) != 0) {
        return 1;
      }
      iVar11 = a->num_bits;
    } while( true );
  }
  pbVar15 = a->zbuffer;
  pbVar2 = a->zbuffer_end;
  uVar8 = 0;
  if (pbVar15 < pbVar2) {
    a->zbuffer = pbVar15 + 1;
    bVar4 = *pbVar15;
    pbVar15 = pbVar15 + 1;
  }
  else {
    bVar4 = 0;
  }
  pbVar16 = pbVar15;
  if (pbVar15 < pbVar2) {
    pbVar16 = pbVar15 + 1;
    a->zbuffer = pbVar16;
    uVar8 = (ushort)*pbVar15;
  }
  pcVar17 = "bad zlib header";
  if ((pbVar16 < pbVar2) && ((ushort)(((ushort)bVar4 << 8 | uVar8) * 0x7bdf) < 0x843)) {
    if ((uVar8 & 0x20) == 0) {
      if ((bVar4 & 0xf) == 8) goto LAB_00103608;
      pcVar17 = "bad compression";
    }
    else {
      pcVar17 = "no preset dict";
    }
  }
  *(char **)(in_FS_OFFSET + -0x20) = pcVar17;
LAB_00103be4:
  return 0;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}